

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrGetSwapchainStateFB
                   (XrSwapchain swapchain,XrSwapchainStateBaseHeaderFB *state)

{
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar1;
  ValidateXrHandleResult VVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_4a1;
  string local_4a0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_480;
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3f0;
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [8];
  string error_message;
  allocator local_359;
  string local_358 [32];
  XrSwapchainStateFoveationFB *local_338;
  XrSwapchainStateFoveationFB *new_swapchainstatefoveationfb_value;
  string local_328 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_308;
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  GenValidUsageXrInstanceInfo *local_2a0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_swapchain_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_278 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  XrSwapchain_T local_1f0 [32];
  ostringstream local_1d0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_44;
  undefined1 local_40 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrSwapchainStateBaseHeaderFB *state_local;
  XrSwapchain swapchain_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  state_local = (XrSwapchainStateBaseHeaderFB *)swapchain;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  local_44 = XR_OBJECT_TYPE_SWAPCHAIN;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSwapchain_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_40
             ,(XrSwapchain_T **)&state_local,&local_44);
  VVar2 = VerifyXrSwapchainHandle((XrSwapchain *)&state_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSwapchain_T_*>::getWithInstanceInfo
                      (&g_swapchain_info,(XrSwapchain_T *)state_local);
    pVar3.second = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    local_2a0 = pVar3.second;
    gen_swapchain_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar3.second;
    if (state == (XrSwapchainStateBaseHeaderFB *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2c0,"VUID-xrGetSwapchainStateFB-state-parameter",&local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"xrGetSwapchainStateFB",&local_2e9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_308,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_328,
                 "Invalid NULL for XrSwapchainStateBaseHeaderFB \"state\" which is not optional and must be non-NULL"
                 ,(allocator *)((long)&new_swapchainstatefoveationfb_value + 7));
      CoreValidLogMessage(pVar3.second,(string *)local_2c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2e8,&local_308,(string *)local_328);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&new_swapchainstatefoveationfb_value + 7));
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_308);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      swapchain_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      local_338 = (XrSwapchainStateFoveationFB *)state;
      pVar1 = pVar3;
      if (state->type == XR_TYPE_SWAPCHAIN_STATE_FOVEATION_FB) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_358,"xrGetSwapchainStateFB",&local_359);
        objects_info.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             ValidateXrStruct(pVar3.second,(string *)local_358,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)local_40,false,true,local_338);
        std::__cxx11::string::~string(local_358);
        std::allocator<char>::~allocator((allocator<char> *)&local_359);
        pVar1.second = (GenValidUsageXrInstanceInfo *)info_with_instance.first;
        pVar1.first = gen_swapchain_info;
        pVar3.second = local_2a0;
        pVar3.first = (GenValidUsageXrHandleInfo *)gen_instance_info;
        if (objects_info.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_380,"Command xrGetSwapchainStateFB param state",&local_381);
          std::allocator<char>::~allocator((allocator<char> *)&local_381);
          std::__cxx11::string::operator+=(local_380," is invalid");
          pVar3.second = local_2a0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_3a8,"VUID-xrGetSwapchainStateFB-state-parameter",&local_3a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3d0,"xrGetSwapchainStateFB",&local_3d1);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_3f0,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_40);
          CoreValidLogMessage(pVar3.second,(string *)local_3a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_3d0,&local_3f0,(string *)local_380);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_3f0);
          std::__cxx11::string::~string(local_3d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
          std::__cxx11::string::~string(local_3a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
          swapchain_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          info_with_instance.second._4_4_ = 1;
          std::__cxx11::string::~string(local_380);
          goto LAB_002b8510;
        }
      }
      info_with_instance.first = (GenValidUsageXrHandleInfo *)pVar1.second;
      gen_swapchain_info = pVar1.first;
      local_2a0 = pVar3.second;
      pVar3.second = local_2a0;
      gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_410,"xrGetSwapchainStateFB",&local_411);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pVar3.second,(string *)local_410,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_40,false,true,state);
      std::__cxx11::string::~string(local_410);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
      pVar3.second = local_2a0;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        swapchain_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_438,"VUID-xrGetSwapchainStateFB-state-parameter",&local_439);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_460,"xrGetSwapchainStateFB",&local_461);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_480,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_40);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_4a0,"Command xrGetSwapchainStateFB param state is invalid",&local_4a1);
        CoreValidLogMessage(pVar3.second,(string *)local_438,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_460,&local_480,(string *)local_4a0);
        std::__cxx11::string::~string(local_4a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_480);
        std::__cxx11::string::~string(local_460);
        std::allocator<char>::~allocator((allocator<char> *)&local_461);
        std::__cxx11::string::~string(local_438);
        std::allocator<char>::~allocator((allocator<char> *)&local_439);
        swapchain_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d0);
    std::operator<<((ostream *)local_1d0,"Invalid XrSwapchain handle \"swapchain\" ");
    HandleToHexString<XrSwapchain_T*>(local_1f0);
    std::operator<<((ostream *)local_1d0,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_210,"VUID-xrGetSwapchainStateFB-swapchain-parameter",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"xrGetSwapchainStateFB",&local_239);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_258,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_40);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_210,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_238,&local_258,local_278);
    std::__cxx11::string::~string((string *)local_278);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_258);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    swapchain_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d0);
  }
LAB_002b8510:
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  return swapchain_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrGetSwapchainStateFB(
XrSwapchain swapchain,
XrSwapchainStateBaseHeaderFB* state) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(swapchain, XR_OBJECT_TYPE_SWAPCHAIN);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSwapchainHandle(&swapchain);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSwapchain handle \"swapchain\" ";
                oss << HandleToHexString(swapchain);
                CoreValidLogMessage(nullptr, "VUID-xrGetSwapchainStateFB-swapchain-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSwapchainStateFB",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_swapchain_info.getWithInstanceInfo(swapchain);
        GenValidUsageXrHandleInfo *gen_swapchain_info = info_with_instance.first;
        (void)gen_swapchain_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == state) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSwapchainStateFB-state-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSwapchainStateFB", objects_info,
                                "Invalid NULL for XrSwapchainStateBaseHeaderFB \"state\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate if XrSwapchainStateBaseHeaderFB is a child structure of type XrSwapchainStateFoveationFB and it is valid
        {
            XrSwapchainStateFoveationFB* new_swapchainstatefoveationfb_value = reinterpret_cast<XrSwapchainStateFoveationFB*>(state);
            if (new_swapchainstatefoveationfb_value->type == XR_TYPE_SWAPCHAIN_STATE_FOVEATION_FB) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrGetSwapchainStateFB",
                                                                objects_info,false, true, new_swapchainstatefoveationfb_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrGetSwapchainStateFB param state";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrGetSwapchainStateFB-state-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSwapchainStateFB",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
#if defined(XR_USE_PLATFORM_ANDROID) && defined(XR_USE_PLATFORM_ANDROID)
        // Validate if XrSwapchainStateBaseHeaderFB is a child structure of type XrSwapchainStateAndroidSurfaceDimensionsFB and it is valid
        {
            XrSwapchainStateAndroidSurfaceDimensionsFB* new_swapchainstateandroidsurfacedimensionsfb_value = reinterpret_cast<XrSwapchainStateAndroidSurfaceDimensionsFB*>(state);
            if (new_swapchainstateandroidsurfacedimensionsfb_value->type == XR_TYPE_SWAPCHAIN_STATE_ANDROID_SURFACE_DIMENSIONS_FB) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrGetSwapchainStateFB",
                                                                objects_info,false, true, new_swapchainstateandroidsurfacedimensionsfb_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrGetSwapchainStateFB param state";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrGetSwapchainStateFB-state-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSwapchainStateFB",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
#endif // defined(XR_USE_PLATFORM_ANDROID) && defined(XR_USE_PLATFORM_ANDROID)
#if defined(XR_USE_GRAPHICS_API_OPENGL_ES) && defined(XR_USE_GRAPHICS_API_OPENGL_ES)
        // Validate if XrSwapchainStateBaseHeaderFB is a child structure of type XrSwapchainStateSamplerOpenGLESFB and it is valid
        {
            XrSwapchainStateSamplerOpenGLESFB* new_swapchainstatesampleropenglesfb_value = reinterpret_cast<XrSwapchainStateSamplerOpenGLESFB*>(state);
            if (new_swapchainstatesampleropenglesfb_value->type == XR_TYPE_SWAPCHAIN_STATE_SAMPLER_OPENGL_ES_FB) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrGetSwapchainStateFB",
                                                                objects_info,false, true, new_swapchainstatesampleropenglesfb_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrGetSwapchainStateFB param state";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrGetSwapchainStateFB-state-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSwapchainStateFB",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
#endif // defined(XR_USE_GRAPHICS_API_OPENGL_ES) && defined(XR_USE_GRAPHICS_API_OPENGL_ES)
#if defined(XR_USE_GRAPHICS_API_VULKAN) && defined(XR_USE_GRAPHICS_API_VULKAN)
        // Validate if XrSwapchainStateBaseHeaderFB is a child structure of type XrSwapchainStateSamplerVulkanFB and it is valid
        {
            XrSwapchainStateSamplerVulkanFB* new_swapchainstatesamplervulkanfb_value = reinterpret_cast<XrSwapchainStateSamplerVulkanFB*>(state);
            if (new_swapchainstatesamplervulkanfb_value->type == XR_TYPE_SWAPCHAIN_STATE_SAMPLER_VULKAN_FB) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrGetSwapchainStateFB",
                                                                objects_info,false, true, new_swapchainstatesamplervulkanfb_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrGetSwapchainStateFB param state";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrGetSwapchainStateFB-state-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSwapchainStateFB",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
#endif // defined(XR_USE_GRAPHICS_API_VULKAN) && defined(XR_USE_GRAPHICS_API_VULKAN)
        // Validate that the base-structure XrSwapchainStateBaseHeaderFB is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetSwapchainStateFB", objects_info,
                                                        false, true, state);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetSwapchainStateFB-state-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetSwapchainStateFB",
                                objects_info,
                                "Command xrGetSwapchainStateFB param state is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}